

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

Usage __thiscall
de::Random::
chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage_const*,float_const*>
          (Random *this,Usage *first,Usage *last,float *weight)

{
  float fVar1;
  float local_4c;
  float w;
  float curWeight;
  Usage *lastNonZero;
  int local_38;
  float p;
  int ndx;
  float weightSum;
  float *weight_local;
  Usage *last_local;
  Usage *first_local;
  Random *this_local;
  
  p = 0.0;
  for (local_38 = 0; first + local_38 != last; local_38 = local_38 + 1) {
    p = weight[local_38] + p;
  }
  fVar1 = getFloat(this,0.0,p);
  local_4c = 0.0;
  local_38 = 0;
  _w = last;
  while( true ) {
    if (first + local_38 == last) {
      return *_w;
    }
    local_4c = weight[local_38] + local_4c;
    if (fVar1 < local_4c) break;
    if (0.0 < weight[local_38]) {
      _w = first + local_38;
    }
    local_38 = local_38 + 1;
  }
  return first[local_38];
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}